

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

LY_ERR lysp_ext_find_definition
                 (ly_ctx *ctx,lysp_ext_instance *ext,lys_module **ext_mod,lysp_ext **ext_def)

{
  lysp_ext *plVar1;
  lysp_ext *plVar2;
  lysp_include *plVar3;
  int iVar4;
  lys_module *plVar5;
  lysc_ext *plVar6;
  ulong uVar7;
  ulong uVar8;
  lysp_module *plVar9;
  lysc_ext *plVar10;
  lysp_ext *plVar11;
  lysp_ext *local_78;
  size_t pref_len;
  char *prefix;
  char *name;
  size_t name_len;
  char *tmp;
  
  if (ext_def != (lysp_ext **)0x0) {
    *ext_def = (lysp_ext *)0x0;
  }
  tmp = ext->name;
  ly_parse_nodeid(&tmp,&prefix,&pref_len,&name,&name_len);
  plVar5 = ly_resolve_prefix(ctx,prefix,CONCAT44(pref_len._4_4_,(uint)pref_len),ext->format,
                             ext->prefix_data);
  *ext_mod = plVar5;
  if (plVar5 == (lys_module *)0x0) {
    ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
            "Invalid prefix \"%.*s\" used for extension instance identifier.",(ulong)(uint)pref_len,
            prefix);
    return LY_EVALID;
  }
  if (ext_def != (lysp_ext **)0x0) {
    plVar9 = plVar5->parsed;
    plVar2 = plVar9->extensions;
    plVar11 = plVar2 + -1;
    plVar10 = (lysc_ext *)0xffffffffffffffff;
    do {
      if (plVar2 == (lysp_ext *)0x0) {
        plVar6 = (lysc_ext *)0x0;
      }
      else {
        plVar6 = plVar2[-1].compiled;
      }
      plVar10 = (lysc_ext *)((long)&plVar10->name + 1);
      if (plVar6 <= plVar10) {
        if (*ext_def != (lysp_ext *)0x0) {
          return LY_SUCCESS;
        }
        local_78 = (lysp_ext *)0x0;
        uVar8 = 0;
        do {
          plVar3 = plVar9->includes;
          if (plVar3 == (lysp_include *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = *(ulong *)(plVar3[-1].rev + 8);
          }
          if (uVar7 <= uVar8) {
            if (local_78 != (lysp_ext *)0x0) {
              return LY_SUCCESS;
            }
            ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                    "Extension definition of extension instance \"%s\" not found.",ext->name);
            return LY_EVALID;
          }
          plVar2 = (plVar3[uVar8].submodule)->extensions;
          plVar11 = plVar2 + -1;
          plVar10 = (lysc_ext *)0xffffffffffffffff;
          do {
            if (plVar2 == (lysp_ext *)0x0) {
              plVar6 = (lysc_ext *)0x0;
            }
            else {
              plVar6 = plVar2[-1].compiled;
            }
            plVar10 = (lysc_ext *)((long)&plVar10->name + 1);
            if (plVar6 <= plVar10) goto LAB_0015f416;
            plVar1 = plVar11 + 1;
            plVar11 = plVar11 + 1;
            iVar4 = strcmp(name,plVar1->name);
          } while (iVar4 != 0);
          *ext_def = plVar11;
          plVar9 = plVar5->parsed;
          local_78 = plVar11;
LAB_0015f416:
          uVar8 = uVar8 + 1;
        } while( true );
      }
      plVar1 = plVar11 + 1;
      plVar11 = plVar11 + 1;
      iVar4 = strcmp(name,plVar1->name);
    } while (iVar4 != 0);
    *ext_def = plVar11;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lysp_ext_find_definition(const struct ly_ctx *ctx, const struct lysp_ext_instance *ext, const struct lys_module **ext_mod,
        struct lysp_ext **ext_def)
{
    const char *tmp, *name, *prefix;
    size_t pref_len, name_len;
    LY_ARRAY_COUNT_TYPE u, v;
    const struct lys_module *mod = NULL;
    const struct lysp_submodule *submod;

    if (ext_def) {
        *ext_def = NULL;
    }

    /* parse the prefix, the nodeid was previously already parsed and checked */
    tmp = ext->name;
    ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len);

    /* get module where the extension definition should be placed */
    *ext_mod = mod = ly_resolve_prefix(ctx, prefix, pref_len, ext->format, ext->prefix_data);
    if (!mod) {
        LOGVAL(ctx, LYVE_REFERENCE, "Invalid prefix \"%.*s\" used for extension instance identifier.", (int)pref_len, prefix);
        return LY_EVALID;
    }

    if (!ext_def) {
        /* we are done */
        return LY_SUCCESS;
    }

    /* find the parsed extension definition there */
    LY_ARRAY_FOR(mod->parsed->extensions, v) {
        if (!strcmp(name, mod->parsed->extensions[v].name)) {
            *ext_def = &mod->parsed->extensions[v];
            break;
        }
    }
    if (!*ext_def) {
        LY_ARRAY_FOR(mod->parsed->includes, u) {
            submod = mod->parsed->includes[u].submodule;
            LY_ARRAY_FOR(submod->extensions, v) {
                if (!strcmp(name, submod->extensions[v].name)) {
                    *ext_def = &submod->extensions[v];
                    break;
                }
            }
        }
    }

    if (!*ext_def) {
        LOGVAL(ctx, LYVE_REFERENCE, "Extension definition of extension instance \"%s\" not found.", ext->name);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}